

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Curiosity.cpp
# Opt level: O2

void __thiscall
chrono::curiosity::Curiosity::Curiosity
          (Curiosity *this,ChSystem *system,CuriosityChassisType chassis_type,
          CuriosityWheelType wheel_type)

{
  ChContactMethod contact_method;
  __shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2> local_90 [6];
  
  this->m_system = system;
  this->m_initialized = false;
  memset(&this->m_chassis,0,0x350);
  contact_method = (**(code **)(*(long *)system + 0x178))(system);
  if (contact_method == NSC) {
    chrono::collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
    chrono::collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
  }
  DefaultContactMaterial((curiosity *)local_90,contact_method);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_default_material).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90[0]._M_refcount);
  DefaultContactMaterial((curiosity *)local_90,contact_method);
  std::__shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->m_wheel_material).
              super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>,local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90[0]._M_refcount);
  Create(this,chassis_type,wheel_type);
  return;
}

Assistant:

Curiosity::Curiosity(ChSystem* system, CuriosityChassisType chassis_type, CuriosityWheelType wheel_type)
    : m_system(system), m_initialized(false) {
    // Set default collision model envelope commensurate with model dimensions.
    // Note that an SMC system automatically sets envelope to 0.
    auto contact_method = m_system->GetContactMethod();
    if (contact_method == ChContactMethod::NSC) {
        collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
        collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    }

    // Create the contact materials
    m_default_material = DefaultContactMaterial(contact_method);
    m_wheel_material = DefaultContactMaterial(contact_method);

    Create(chassis_type, wheel_type);
}